

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_jxx(TCGContext_conflict9 *s,int opc,TCGLabel *l,int _small)

{
  tcg_insn_unit *ptVar1;
  int *piVar2;
  int iVar3;
  TCGRelocation *pTVar4;
  tcg_insn_unit tVar5;
  long lVar6;
  
  if ((undefined1  [40])((undefined1  [40])*l & (undefined1  [40])0x2) == (undefined1  [40])0x0) {
    if (opc == -1) {
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = 0xe9;
    }
    else {
      tcg_out_opc(s,opc + 0x180,0,0,0);
    }
    ptVar1 = s->code_ptr;
    pTVar4 = (TCGRelocation *)tcg_malloc(s,0x20);
    pTVar4->type = 2;
    pTVar4->ptr = ptVar1;
    pTVar4->addend = -4;
    (pTVar4->next).sqe_next = (TCGRelocation *)0x0;
    *(l->relocs).sqh_last = pTVar4;
    (l->relocs).sqh_last = (TCGRelocation **)pTVar4;
    s->code_ptr = s->code_ptr + 4;
  }
  else {
    ptVar1 = s->code_ptr;
    lVar6 = (long)(l->u).value_ptr - (long)ptVar1;
    iVar3 = (int)lVar6;
    if (iVar3 + 0x7eU < 0x100) {
      tVar5 = 0xeb;
      if (opc != -1) {
        tVar5 = (char)opc + 'p';
      }
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = tVar5;
      ptVar1 = s->code_ptr;
      s->code_ptr = ptVar1 + 1;
      *ptVar1 = (char)lVar6 + 0xfe;
    }
    else {
      if (opc == -1) {
        s->code_ptr = ptVar1 + 1;
        *ptVar1 = 0xe9;
        iVar3 = iVar3 + -5;
      }
      else {
        tcg_out_opc(s,opc + 0x180,0,0,0);
        iVar3 = iVar3 + -6;
      }
      piVar2 = (int *)s->code_ptr;
      *piVar2 = iVar3;
      s->code_ptr = (tcg_insn_unit *)(piVar2 + 1);
    }
  }
  return;
}

Assistant:

static void tcg_out_jxx(TCGContext *s, int opc, TCGLabel *l, int _small)
{
    int32_t val, val1;

    if (l->has_value) {
        val = tcg_pcrel_diff(s, l->u.value_ptr);
        val1 = val - 2;
        if ((int8_t)val1 == val1) {
            if (opc == -1) {
                tcg_out8(s, OPC_JMP_short);
            } else {
                tcg_out8(s, OPC_JCC_short + opc);
            }
            tcg_out8(s, val1);
        } else {
            if (_small) {
                tcg_abort();
            }
            if (opc == -1) {
                tcg_out8(s, OPC_JMP_long);
                tcg_out32(s, val - 5);
            } else {
                tcg_out_opc(s, OPC_JCC_long + opc, 0, 0, 0);
                tcg_out32(s, val - 6);
            }
        }
    } else if (_small) {
        if (opc == -1) {
            tcg_out8(s, OPC_JMP_short);
        } else {
            tcg_out8(s, OPC_JCC_short + opc);
        }
        tcg_out_reloc(s, s->code_ptr, R_386_PC8, l, -1);
        s->code_ptr += 1;
    } else {
        if (opc == -1) {
            tcg_out8(s, OPC_JMP_long);
        } else {
            tcg_out_opc(s, OPC_JCC_long + opc, 0, 0, 0);
        }
        tcg_out_reloc(s, s->code_ptr, R_386_PC32, l, -4);
        s->code_ptr += 4;
    }
}